

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,SimdShuffleOpExpr *expr)

{
  Enum EVar1;
  Newline local_62;
  uint8_t local_61;
  int local_60;
  Type TStack_5c;
  int i;
  StackVar local_54;
  Type local_48;
  StackVar local_40;
  Type local_34;
  StackVar local_2c;
  Type local_20;
  Type result_type;
  SimdShuffleOpExpr *expr_local;
  CWriter *this_local;
  
  result_type = (Type)expr;
  local_20 = Opcode::GetResultType(&expr->opcode);
  EVar1 = Opcode::operator_cast_to_Enum((Opcode *)((long)result_type + 0x3c));
  if (EVar1 == I8X16Shuffle) {
    local_34 = local_20;
    StackVar::StackVar(&local_2c,1,local_20);
    Type::Type(&local_48,Any);
    StackVar::StackVar(&local_40,1,local_48);
    Type::Type(&stack0xffffffffffffffa4,Any);
    StackVar::StackVar(&local_54,0,TStack_5c);
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[23],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar>
              ((CWriter *)this,&local_2c,(char (*) [23])" = v128_i8x16_shuffle(",&local_40,
               (char (*) [3])0x23cd10,&local_54);
    for (local_60 = 0; local_60 < 0x10; local_60 = local_60 + 1) {
      local_61 = v128::u8((v128 *)((long)result_type + 0x40),local_60);
      (anonymous_namespace)::CWriter::Write<char_const(&)[3],unsigned_char>
                ((CWriter *)this,(char (*) [3])0x23cd10,&local_61);
    }
    (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [3])0x239d95,&local_62);
    DropTypes(this,2);
    PushType(this,local_20);
    return;
  }
  abort();
}

Assistant:

void CWriter::Write(const SimdShuffleOpExpr& expr) {
  Type result_type = expr.opcode.GetResultType();
  switch (expr.opcode) {
    case Opcode::I8X16Shuffle: {
      Write(StackVar(1, result_type), " = v128_i8x16_shuffle(", StackVar(1),
            ", ", StackVar(0));
      for (int i = 0; i < 16; i++) {
        Write(", ", expr.val.u8(i));
      }
      Write(");", Newline());
      DropTypes(2);
      break;
    }
    default:
      WABT_UNREACHABLE;
  }
  PushType(result_type);
}